

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::showHelp(CommandParser *parser)

{
  OptionParser *this;
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  ostream *poVar5;
  bool bVar6;
  pointer pPVar7;
  bool bVar8;
  string exeName;
  AllOptions options;
  HelpOptionParser helpOpt;
  Command local_190;
  string local_158;
  long *local_138;
  long local_130;
  long local_128 [2];
  long *local_118;
  long local_110;
  long local_108 [2];
  string local_f8;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  AllOptions local_b8;
  string local_a0;
  string local_80;
  OptionParser local_60;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,*parser->m_argv,(allocator<char> *)&local_190);
  lVar4 = std::__cxx11::string::find_last_of((char *)&local_d8,0x1af35d,0xffffffffffffffff);
  if (lVar4 != -1) {
    std::__cxx11::string::substr((ulong)&local_190,(ulong)&local_d8);
    std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_190);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190.m_name._M_dataplus._M_p != &local_190.m_name.field_2) {
      operator_delete(local_190.m_name._M_dataplus._M_p,
                      local_190.m_name.field_2._M_allocated_capacity + 1);
    }
  }
  AllOptions::AllOptions(&local_b8);
  Options::HelpOptionParser::HelpOptionParser((HelpOptionParser *)&local_60);
  if (local_b8.m_parsers.
      super__Vector_base<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.m_parsers.
      super__Vector_base<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar6 = false;
    pPVar7 = local_b8.m_parsers.
             super__Vector_base<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      this = pPVar7->m_p;
      OptionParser::find(&local_190,this,parser);
      bVar1 = local_190.m_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_190.m_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = local_190.m_name._M_string_length != 0;
      if (bVar1 || bVar2) {
        OptionParser::optionNames_abi_cxx11_(&local_f8,this);
        OptionParser::optionNames_abi_cxx11_(&local_80,&local_60);
        bVar8 = true;
        if (local_f8._M_string_length == local_80._M_string_length) {
          if (local_f8._M_string_length == 0) goto LAB_001300d6;
          iVar3 = bcmp(local_f8._M_dataplus._M_p,local_80._M_dataplus._M_p,local_f8._M_string_length
                      );
          bVar8 = iVar3 != 0;
        }
      }
      else {
LAB_001300d6:
        bVar8 = false;
      }
      if (bVar1 || bVar2) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_190.m_args);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190.m_name._M_dataplus._M_p != &local_190.m_name.field_2) {
        operator_delete(local_190.m_name._M_dataplus._M_p,
                        local_190.m_name.field_2._M_allocated_capacity + 1);
      }
      if (bVar8) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        OptionParser::optionNames_abi_cxx11_(&local_190.m_name,this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,local_190.m_name._M_dataplus._M_p,
                            local_190.m_name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        (*(this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
          [5])(&local_118,this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_118,local_110);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n\n",2);
        (*(this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
          [6])(&local_138,this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(char *)local_138,local_130);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n\n",2);
        (*(this->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable
          [7])(&local_a0,this);
        addLineBreaks(&local_158,&local_a0,0x50,2);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_158._M_dataplus._M_p,local_158._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_158._M_dataplus._M_p != &local_158.field_2) {
          operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if (local_138 != local_128) {
          operator_delete(local_138,local_128[0] + 1);
        }
        if (local_118 != local_108) {
          operator_delete(local_118,local_108[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_190.m_name._M_dataplus._M_p != &local_190.m_name.field_2) {
          operator_delete(local_190.m_name._M_dataplus._M_p,
                          local_190.m_name.field_2._M_allocated_capacity + 1);
        }
        bVar6 = true;
      }
      pPVar7 = pPVar7 + 1;
    } while (pPVar7 != local_b8.m_parsers.
                       super__Vector_base<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (bVar6) goto LAB_001303ef;
  }
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_d8,local_d0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5," is a CATCH host application. Options are as follows:\n\n",0x37);
  showUsage((ostream *)&std::cout);
LAB_001303ef:
  local_60.super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (NonCopyable)&PTR__OptionParser_001d5f40;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60.m_optionNames);
  std::vector<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>::
  ~vector(&local_b8.m_parsers);
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  return;
}

Assistant:

inline void showHelp( const CommandParser& parser ) {
        std::string exeName = parser.exeName();
        std::string::size_type pos = exeName.find_last_of( "/\\" );
        if( pos != std::string::npos ) {
            exeName = exeName.substr( pos+1 );
        }

        AllOptions options;
        Options::HelpOptionParser helpOpt;
        bool displayedSpecificOption = false;
        for( AllOptions::const_iterator it = options.begin(); it != options.end(); ++it ) {
            OptionParser& opt = **it;
            if( opt.find( parser ) && opt.optionNames() != helpOpt.optionNames() ) {
                displayedSpecificOption = true;
                std::cout   << "\n" << opt.optionNames() << " " << opt.argsSynopsis() << "\n\n"
                            << opt.optionSummary() << "\n\n"

                << addLineBreaks( opt.optionDescription(), 80, 2 ) << "\n" << std::endl;
            }
        }

        if( !displayedSpecificOption ) {
            std::cout << exeName << " is a CATCH host application. Options are as follows:\n\n";
            showUsage( std::cout );
        }
    }